

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Parser * __thiscall Catch::Clara::Parser::operator|=(Parser *this,Parser *other)

{
  std::vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Catch::Clara::Opt_const*,std::vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>>>>
            ((vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>> *)&this->m_options,
             (this->m_options).
             super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (other->m_options).
             super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
             super__Vector_impl_data._M_start,
             (other->m_options).
             super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Catch::Clara::Arg_const*,std::vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>>>>
            ((vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>> *)&this->m_args,
             (this->m_args).
             super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (other->m_args).
             super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
             super__Vector_impl_data._M_start,
             (other->m_args).
             super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return this;
}

Assistant:

Parser& Parser::operator|=( Parser const& other ) {
            m_options.insert( m_options.end(),
                              other.m_options.begin(),
                              other.m_options.end() );
            m_args.insert(
                m_args.end(), other.m_args.begin(), other.m_args.end() );
            return *this;
        }